

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall
HFactor::ftranCall(HFactor *this,HVector *vector,double expected_density,
                  HighsTimerClock *factor_timer_clock_pointer)

{
  int iVar1;
  FactorTimer factor_timer;
  
  iVar1 = vector->count;
  FactorTimer::start(&factor_timer,5,factor_timer_clock_pointer);
  ftranL(this,vector,expected_density,factor_timer_clock_pointer);
  ftranU(this,vector,expected_density,factor_timer_clock_pointer);
  if (-1 < iVar1) {
    HVectorBase<double>::reIndex(vector);
  }
  FactorTimer::stop(&factor_timer,5,factor_timer_clock_pointer);
  return;
}

Assistant:

void HFactor::ftranCall(HVector& vector, const double expected_density,
                        HighsTimerClock* factor_timer_clock_pointer) const {
  const bool use_indices = vector.count >= 0;
  FactorTimer factor_timer;
  factor_timer.start(FactorFtran, factor_timer_clock_pointer);
  ftranL(vector, expected_density, factor_timer_clock_pointer);
  ftranU(vector, expected_density, factor_timer_clock_pointer);
  // Possibly find the indices in order
  if (use_indices) vector.reIndex();
  factor_timer.stop(FactorFtran, factor_timer_clock_pointer);
}